

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPFakeTransmitter::SetMaximumPacketSize(RTPFakeTransmitter *this,size_t s)

{
  size_t s_local;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x84;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x83;
  }
  else if (s < 0x10000) {
    this->maxpacksize = s;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0x86;
  }
  return this_local._4_4_;
}

Assistant:

int RTPFakeTransmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}
	if (s > RTPFAKETRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}